

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

void delete_filter(rar_filter *filter)

{
  rar_filter *prVar1;
  rar_filter *next;
  rar_filter *filter_local;
  
  next = filter;
  while (next != (rar_filter *)0x0) {
    prVar1 = next->next;
    free(next->globaldata);
    free(next);
    next = prVar1;
  }
  return;
}

Assistant:

static void
delete_filter(struct rar_filter *filter)
{
  while (filter)
  {
    struct rar_filter *next = filter->next;
    free(filter->globaldata);
    free(filter);
    filter = next;
  }
}